

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qgraphicstransform.cpp
# Opt level: O0

void QGraphicsScale::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  long lVar1;
  qreal *pqVar2;
  bool bVar3;
  QtMocHelpers *in_RCX;
  uint in_EDX;
  int in_ESI;
  long in_FS_OFFSET;
  qreal qVar4;
  QVector3D QVar5;
  void *_v_1;
  void *_v;
  QGraphicsScale *_t;
  QGraphicsScale *in_stack_ffffffffffffff40;
  QGraphicsScale *in_stack_ffffffffffffff48;
  QGraphicsScale *in_stack_ffffffffffffff50;
  QGraphicsScale *in_stack_ffffffffffffff58;
  qreal local_28;
  float local_20;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (in_ESI == 0) {
    in_stack_ffffffffffffff50 = (QGraphicsScale *)(ulong)in_EDX;
    switch(in_stack_ffffffffffffff50) {
    case (QGraphicsScale *)0x0:
      originChanged((QGraphicsScale *)0xa2e8a9);
      break;
    case (QGraphicsScale *)0x1:
      xScaleChanged((QGraphicsScale *)0xa2e8b8);
      break;
    case (QGraphicsScale *)0x2:
      yScaleChanged((QGraphicsScale *)0xa2e8c7);
      break;
    case (QGraphicsScale *)0x3:
      zScaleChanged((QGraphicsScale *)0xa2e8d6);
      break;
    case (QGraphicsScale *)0x4:
      scaleChanged((QGraphicsScale *)0xa2e8e5);
    }
  }
  if ((in_ESI != 5) ||
     ((((bVar3 = QtMocHelpers::indexOfMethod<void(QGraphicsScale::*)()>
                           (in_RCX,(void **)originChanged,0,0), !bVar3 &&
        (bVar3 = QtMocHelpers::indexOfMethod<void(QGraphicsScale::*)()>
                           (in_RCX,(void **)xScaleChanged,0,1), !bVar3)) &&
       (bVar3 = QtMocHelpers::indexOfMethod<void(QGraphicsScale::*)()>
                          (in_RCX,(void **)yScaleChanged,0,2), !bVar3)) &&
      ((bVar3 = QtMocHelpers::indexOfMethod<void(QGraphicsScale::*)()>
                          (in_RCX,(void **)zScaleChanged,0,3), !bVar3 &&
       (bVar3 = QtMocHelpers::indexOfMethod<void(QGraphicsScale::*)()>
                          (in_RCX,(void **)scaleChanged,0,4), !bVar3)))))) {
    if (in_ESI == 1) {
      pqVar2 = *(qreal **)in_RCX;
      in_stack_ffffffffffffff48 = (QGraphicsScale *)(ulong)in_EDX;
      switch(in_stack_ffffffffffffff48) {
      case (QGraphicsScale *)0x0:
        QVar5 = origin(in_stack_ffffffffffffff58);
        local_28 = QVar5.v._0_8_;
        local_20 = QVar5.v[2];
        *pqVar2 = local_28;
        *(float *)(pqVar2 + 1) = local_20;
        break;
      case (QGraphicsScale *)0x1:
        qVar4 = xScale(in_stack_ffffffffffffff40);
        *pqVar2 = qVar4;
        break;
      case (QGraphicsScale *)0x2:
        qVar4 = yScale(in_stack_ffffffffffffff40);
        *pqVar2 = qVar4;
        break;
      case (QGraphicsScale *)0x3:
        qVar4 = zScale(in_stack_ffffffffffffff40);
        *pqVar2 = qVar4;
      }
    }
    if (in_ESI == 2) {
      switch((QVector3D *)(ulong)in_EDX) {
      case (QVector3D *)0x0:
        setOrigin(in_stack_ffffffffffffff48,(QVector3D *)(ulong)in_EDX);
        break;
      case (QVector3D *)0x1:
        setXScale(in_stack_ffffffffffffff50,(qreal)in_stack_ffffffffffffff48);
        break;
      case (QVector3D *)0x2:
        setYScale(in_stack_ffffffffffffff50,(qreal)in_stack_ffffffffffffff48);
        break;
      case (QVector3D *)0x3:
        setZScale(in_stack_ffffffffffffff50,(qreal)in_stack_ffffffffffffff48);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QGraphicsScale::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = static_cast<QGraphicsScale *>(_o);
    if (_c == QMetaObject::InvokeMetaMethod) {
        switch (_id) {
        case 0: _t->originChanged(); break;
        case 1: _t->xScaleChanged(); break;
        case 2: _t->yScaleChanged(); break;
        case 3: _t->zScaleChanged(); break;
        case 4: _t->scaleChanged(); break;
        default: ;
        }
    }
    if (_c == QMetaObject::IndexOfMethod) {
        if (QtMocHelpers::indexOfMethod<void (QGraphicsScale::*)()>(_a, &QGraphicsScale::originChanged, 0))
            return;
        if (QtMocHelpers::indexOfMethod<void (QGraphicsScale::*)()>(_a, &QGraphicsScale::xScaleChanged, 1))
            return;
        if (QtMocHelpers::indexOfMethod<void (QGraphicsScale::*)()>(_a, &QGraphicsScale::yScaleChanged, 2))
            return;
        if (QtMocHelpers::indexOfMethod<void (QGraphicsScale::*)()>(_a, &QGraphicsScale::zScaleChanged, 3))
            return;
        if (QtMocHelpers::indexOfMethod<void (QGraphicsScale::*)()>(_a, &QGraphicsScale::scaleChanged, 4))
            return;
    }
    if (_c == QMetaObject::ReadProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: *reinterpret_cast<QVector3D*>(_v) = _t->origin(); break;
        case 1: *reinterpret_cast<qreal*>(_v) = _t->xScale(); break;
        case 2: *reinterpret_cast<qreal*>(_v) = _t->yScale(); break;
        case 3: *reinterpret_cast<qreal*>(_v) = _t->zScale(); break;
        default: break;
        }
    }
    if (_c == QMetaObject::WriteProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: _t->setOrigin(*reinterpret_cast<QVector3D*>(_v)); break;
        case 1: _t->setXScale(*reinterpret_cast<qreal*>(_v)); break;
        case 2: _t->setYScale(*reinterpret_cast<qreal*>(_v)); break;
        case 3: _t->setZScale(*reinterpret_cast<qreal*>(_v)); break;
        default: break;
        }
    }
}